

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

intptr_t ArrayFindEx(array *p,size_t Count,size_t Width,void *Data,arraycmp Cmp,void *CmpParam,
                    bool_t *Found)

{
  int iVar1;
  size_t sVar2;
  char *local_70;
  char *i_1;
  intptr_t No;
  intptr_t Upper;
  intptr_t Lower;
  intptr_t Mid;
  int i;
  void *CmpParam_local;
  arraycmp Cmp_local;
  void *Data_local;
  size_t Width_local;
  size_t Count_local;
  array *p_local;
  
  if (p == (array *)0x0) {
    __assert_fail("&(*p)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/array/array.c"
                  ,0x1be,
                  "intptr_t ArrayFindEx(const array *, size_t, size_t, const void *, arraycmp, const void *, bool_t *)"
                 );
  }
  if (p->_Used == 0) {
    *Found = 0;
    p_local = (array *)0x0;
  }
  else {
    Width_local = Count;
    if (Count == 0xffffffffffffffff) {
      sVar2 = ArraySize(p);
      Width_local = sVar2 / Width;
      sVar2 = ArraySize(p);
      if (Width_local * Width != sVar2) {
        __assert_fail("Count*Width == ArraySize(p)",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/array/array.c"
                      ,0x1c7,
                      "intptr_t ArrayFindEx(const array *, size_t, size_t, const void *, arraycmp, const void *, bool_t *)"
                     );
      }
    }
    if (Cmp == (arraycmp)0x0) {
      i_1 = (char *)0x0;
      local_70 = p->_Begin;
      while (Width_local != 0) {
        iVar1 = memcmp(local_70,Data,Width);
        if (iVar1 == 0) {
          *Found = 1;
          return (intptr_t)i_1;
        }
        local_70 = local_70 + Width;
        i_1 = i_1 + 1;
        Width_local = Width_local - 1;
      }
      *Found = 0;
      p_local = (array *)i_1;
    }
    else {
      Lower = 0;
      Upper = 0;
      No = Width_local - 1;
      while (Upper <= No) {
        Lower = No + Upper >> 1;
        if (p == (array *)0x0) {
          __assert_fail("&(*p)!=NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/array/array.c"
                        ,0x1d5,
                        "intptr_t ArrayFindEx(const array *, size_t, size_t, const void *, arraycmp, const void *, bool_t *)"
                       );
        }
        iVar1 = (*Cmp)(CmpParam,p->_Begin + Width * Lower,Data);
        if (iVar1 < 1) {
          if (-1 < iVar1) {
            *Found = 1;
            return Lower;
          }
          Upper = Lower + 1;
        }
        else {
          No = Lower + -1;
        }
      }
      *Found = 0;
      if (No == Lower + -1) {
        p_local = (array *)Lower;
      }
      else {
        p_local = (array *)Upper;
      }
    }
  }
  return (intptr_t)p_local;
}

Assistant:

intptr_t ArrayFindEx(const array* p, size_t Count, size_t Width, const void* Data, arraycmp Cmp, const void* CmpParam, bool_t* Found)
{
    if (ARRAYEMPTY(*p))
    {
        *Found = 0;
        return 0;
    }

    if (Count == ARRAY_AUTO_COUNT)
    {
        Count = ArraySize(p)/Width;
        assert(Count*Width == ArraySize(p));
    }

    if (Cmp)
    {
        int i;
        intptr_t Mid = 0;
        intptr_t Lower = 0;
        intptr_t Upper = Count-1;

        while (Upper >= Lower)
        {
            Mid = (Upper + Lower) >> 1;

            i = Cmp(CmpParam, ARRAYBEGIN(*p,uint8_t) + Width*Mid, Data);
            if (i>0)
                Upper = Mid-1;
            else if (i<0)
                Lower = Mid+1;
            else
            {
                *Found = 1;
                return Mid;
            }
        }

        *Found = 0;

        if (Upper == Mid - 1)
            return Mid;
        else
            return Lower;
    }
    else
    {
        intptr_t No = 0;
        const char* i;
        for (i=p->_Begin;Count--;i+=Width,++No)
            if (memcmp(i,Data,Width)==0)
            {
                *Found = 1;
                return No;
            }

        *Found = 0;
        return No;
    }
}